

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::Anytest_TreatAsSet_DifferentType_Test::
~Anytest_TreatAsSet_DifferentType_Test(Anytest_TreatAsSet_DifferentType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Anytest, TreatAsSet_DifferentType) {
  proto2_unittest::TestField value1;
  value1.set_a(20);
  value1.set_b(30);
  proto2_unittest::TestDiffMessage value2;
  value2.add_rv(40);

  proto2_unittest::TestAny m1, m2;
  m1.add_repeated_any_value()->PackFrom(value1);
  m1.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value1);

  util::MessageDifferencer message_differencer;
  message_differencer.TreatAsSet(GetFieldDescriptor(m1, "repeated_any_value"));
  EXPECT_TRUE(message_differencer.Compare(m1, m2));
}